

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

bool nivalis::anon_unknown_10::parse_polyline_expr
               (string *expr_str,Function *func,Environment *env,int x_var,int y_var,int t_var,
               string *parse_err)

{
  vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *this;
  byte bVar1;
  Expr *pEVar2;
  Function *pFVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  Expr *this_00;
  pointer __pos;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string tmp_err;
  Expr e1;
  string s;
  bool local_f8;
  long *local_f0 [2];
  long local_e0 [2];
  uint local_cc;
  string local_c8;
  long local_a8;
  vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *local_a0;
  Environment *local_98;
  long local_90;
  string *local_88;
  Expr local_80;
  string local_68;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t local_3c;
  Function *local_38;
  
  bVar9 = expr_str->_M_string_length == 0;
  bVar8 = !bVar9;
  local_98 = env;
  local_40 = y_var;
  local_3c = x_var;
  local_38 = func;
  if (bVar9) {
    local_f8 = false;
  }
  else {
    uVar4 = func->type & 0xfffffff8;
    local_a0 = &func->exprs;
    local_a8 = 0;
    local_90 = 0;
    uVar7 = 0;
    local_cc = 0;
    local_f8 = false;
    local_88 = expr_str;
    local_44 = t_var;
    do {
      bVar1 = (local_88->_M_dataplus)._M_p[uVar7];
      iVar5 = isspace((int)(char)bVar1);
      bVar9 = false;
      if (iVar5 == 0) {
        lVar6 = -1;
        if (bVar1 < 0x5d) {
          if (bVar1 != 0x28) {
            if (bVar1 == 0x29) goto LAB_0012a008;
            if (bVar1 != 0x5b) goto LAB_00129fed;
          }
LAB_0012a003:
          local_90 = local_90 + 1;
        }
        else {
          if ((bVar1 != 0x5d) && (bVar1 != 0x7d)) {
            if (bVar1 == 0x7b) goto LAB_0012a003;
LAB_00129fed:
            lVar6 = 0;
          }
LAB_0012a008:
          local_90 = local_90 + lVar6;
        }
        if (bVar1 == 0x2c) {
          bVar9 = false;
          if (local_90 == 1) {
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            local_c8._M_string_length = 0;
            local_c8.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::substr((ulong)&local_68,(ulong)local_88);
            parse(&local_80,&local_68,local_98,true,true,0,&local_c8);
            util::rtrim(&local_c8);
            if ((uVar4 == 0x80) && (local_c8._M_string_length != 0)) {
              parse((Expr *)local_f0,&local_68,local_98,false,true,0,parse_err);
              std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::
              emplace_back<nivalis::Expr>(local_a0,(Expr *)local_f0);
              if (local_f0[0] != (long *)0x0) {
                operator_delete(local_f0[0],local_e0[0] - (long)local_f0[0]);
              }
              local_f8 = true;
            }
            else {
              std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::push_back
                        (local_a0,&local_80);
              if (uVar4 != 0x80) {
                local_f0[0] = local_e0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_f0,local_c8._M_dataplus._M_p,
                           local_c8._M_dataplus._M_p + local_c8._M_string_length);
                std::__cxx11::string::append((char *)local_f0);
                std::__cxx11::string::_M_append((char *)parse_err,(ulong)local_f0[0]);
                if (local_f0[0] != local_e0) {
                  operator_delete(local_f0[0],local_e0[0] + 1);
                }
              }
            }
            if (local_80.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_80.ast.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_80.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_80.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,
                              CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                       local_c8.field_2._M_local_buf[0]) + 1);
            }
            local_a8 = uVar7 + 1;
            local_cc = (uint)CONCAT71((int7)((ulong)local_a8 >> 8),1);
          }
        }
        else if (bVar1 == 0x29) {
          bVar9 = false;
          if (local_90 == 0) {
            if ((local_cc & 1) != 0) {
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              local_c8._M_string_length = 0;
              local_c8.field_2._M_local_buf[0] = '\0';
              std::__cxx11::string::substr((ulong)&local_68,(ulong)local_88);
              parse(&local_80,&local_68,local_98,true,true,0,&local_c8);
              util::rtrim(&local_c8);
              if ((uVar4 == 0x80) && (local_c8._M_string_length != 0)) {
                parse((Expr *)local_f0,&local_68,local_98,false,true,0,parse_err);
                std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::
                emplace_back<nivalis::Expr>(local_a0,(Expr *)local_f0);
                if (local_f0[0] != (long *)0x0) {
                  operator_delete(local_f0[0],local_e0[0] - (long)local_f0[0]);
                }
                local_f8 = true;
              }
              else {
                std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::push_back
                          (local_a0,&local_80);
                if (uVar4 != 0x80) {
                  local_f0[0] = local_e0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_f0,local_c8._M_dataplus._M_p,
                             local_c8._M_dataplus._M_p + local_c8._M_string_length);
                  std::__cxx11::string::append((char *)local_f0);
                  std::__cxx11::string::_M_append((char *)parse_err,(ulong)local_f0[0]);
                  if (local_f0[0] != local_e0) {
                    operator_delete(local_f0[0],local_e0[0] + 1);
                  }
                }
              }
              if (local_80.ast.
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_80.ast.
                                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_80.ast.
                                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_80.ast.
                                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,
                                CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                         local_c8.field_2._M_local_buf[0]) + 1);
              }
              local_cc = 0;
              goto LAB_0012a03e;
            }
            std::__cxx11::string::append((char *)parse_err);
            bVar9 = true;
            local_90 = 0;
          }
        }
        else if (bVar1 == 0x28) {
          if (local_90 == 1) {
            local_a8 = uVar7 + 1;
          }
LAB_0012a03e:
          bVar9 = false;
        }
        else {
          bVar9 = local_90 == 0 && bVar1 != 0x2c;
        }
      }
      t_var = local_44;
      if (bVar9) break;
      uVar7 = uVar7 + 1;
      bVar8 = uVar7 < local_88->_M_string_length;
    } while (bVar8);
  }
  pFVar3 = local_38;
  if (bVar8) {
    local_f8 = false;
  }
  else if (parse_err->_M_string_length == 0) {
    this_00 = (local_38->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pEVar2 = (local_38->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != pEVar2) {
      this = &local_38->exprs;
      do {
        bVar8 = Expr::has_var(this_00,local_3c);
        if ((bVar8) || (bVar8 = Expr::has_var(this_00,local_40), bVar8)) {
          __pos = (this->super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>)._M_impl.
                  super__Vector_impl_data._M_start;
LAB_0012a50f:
          std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::_M_erase_at_end(this,__pos);
          std::__cxx11::string::append((char *)parse_err);
          return local_f8;
        }
        if ((pFVar3->type == 0x80) && (bVar8 = Expr::has_var(this_00,t_var), bVar8)) {
          __pos = (pFVar3->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                  _M_impl.super__Vector_impl_data._M_start;
          if ((long)(pFVar3->exprs).
                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__pos != 0x30) goto LAB_0012a50f;
          pFVar3->type = 0x28;
        }
        this_00 = this_00 + 1;
      } while (this_00 != pEVar2);
    }
  }
  return local_f8;
}

Assistant:

bool parse_polyline_expr(const std::string& expr_str, Function& func,
                         Environment& env, int x_var, int y_var, int t_var,
                         std::string& parse_err) {
    // Try to parse function as polyline expr
    size_t last_begin = 0, stkh = 0;
    bool has_comma = false;
    bool want_reparse = false;
    const bool is_polyline_type = ((func.type& ~Function::FUNC_TYPE_MOD_ALL)
                            == Function::FUNC_TYPE_GEOM_POLYLINE);
    for (size_t i = 0; i < expr_str.size(); ++i) {
        const char c = expr_str[i];
        if (std::isspace(c)) continue;
        // Handle nested brackets
        if (util::is_open_bracket(c)) ++stkh;
        else if (util::is_close_bracket(c)) --stkh;
        switch(c) {
            case '(':
                if (stkh == 1) {
                    last_begin = i + 1;
                }
                break;
            case ',':
                if (stkh == 1) {
                    std::string tmp_err,
                                s = expr_str.substr(last_begin,
                                        i - last_begin);
                    Expr e1 = parse(s, env,
                                true, true, 0, &tmp_err);
                    util::rtrim(tmp_err);
                    if (is_polyline_type && tmp_err.size()) {
                        func.exprs.push_back(parse(s, env,
                                    false, true, 0, &parse_err));
                        want_reparse = true;
                    } else {
                        func.exprs.push_back(e1);
                        if (!is_polyline_type) parse_err.append(tmp_err + "\n");
                    }
                    last_begin = i + 1;
                    has_comma = true;
                }
                break;
            case ')':
                if (stkh == 0) {
                    if (!has_comma) {
                        // Must have comma
                        parse_err.append("Polyline/parametric expression missing ,");
                        return false;
                    }
                    std::string tmp_err,
                                s = expr_str.substr(last_begin,
                                        i - last_begin);
                    Expr e1 = parse(s, env,
                                true, true, 0, &tmp_err);
                    util::rtrim(tmp_err);
                    if (is_polyline_type && tmp_err.size()) {
                        func.exprs.push_back(parse(s, env,
                                    false, true, 0, &parse_err));
                        want_reparse = true;
                    } else {
                        func.exprs.push_back(e1);
                        if (!is_polyline_type) parse_err.append(tmp_err + "\n");
                    }

                    has_comma = false;
                }
                break;
            default:
                // Can't have things between ), (
                // shouldn't happen since should not detect as polyline
                if (!std::isspace(c) && c != ',' && stkh == 0) return false;
        }
    }
    if (parse_err.empty()) {
        for (Expr& e1 : func.exprs) {
            if (e1.has_var(x_var) || e1.has_var(y_var)) {
                // Can't have x,y, show warning
                func.exprs.clear();
                parse_err.append("x, y disallowed in tuple "
                    "(polyline/parametric equation)\n");
                break;
            } else if (func.type == Function::FUNC_TYPE_GEOM_POLYLINE &&
                       e1.has_var(t_var)) {
                // Detect parametric equation
                if (func.exprs.size() != 2) {
                    func.exprs.clear();
                    parse_err.append("Parametric equation can't have "
                        "more than one tuple\n");
                    break;
                } else {
                    // Parametric detection: only single
                    // point and has t
                    func.type = Function::FUNC_TYPE_PARAMETRIC;
                }
            }
        }
    }
    return want_reparse;
}